

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::Vertex::smoothNeighborhood
          (Vertex *this,double diff,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  double dVar3;
  double local_28;
  
  local_28 = 0.0;
  std::
  _Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
  ::_M_emplace_unique<std::_List_iterator<CMU462::Halfedge>&,double>
            ((_Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
              *)seen,&this->_halfedge,&local_28);
  getNeighborhood(this,seen,depth);
  for (p_Var2 = (seen->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(seen->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    lVar1 = *(long *)(*(long *)(p_Var2 + 1) + 0x28);
    dVar3 = -(double)p_Var2[1]._M_parent * (double)p_Var2[1]._M_parent;
    dVar3 = exp(dVar3 + dVar3);
    *(float *)(lVar1 + 0x6c) = (float)((double)*(float *)(lVar1 + 0x6c) + dVar3 * diff);
  }
  return;
}

Assistant:

void Vertex::smoothNeighborhood(double diff, map<HalfedgeIter, double>& seen, int depth) {

    seen.emplace(_halfedge, 0.0);

    getNeighborhood(seen, depth);

    for (auto hd : seen) {
      HalfedgeIter h = hd.first;
      VertexIter u = h->vertex();
      double dist = hd.second;
      double newDiff = diff*exp(-dist*dist *2.0);
      u->offset += newDiff;
    }
  }